

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O0

longlong __thiscall
ValueExtractor<long_long>::operator()(ValueExtractor<long_long> *this,int param_2)

{
  runtime_error *this_00;
  string local_30 [16];
  char **in_stack_ffffffffffffffe0;
  char (*in_stack_ffffffffffffffe8) [16];
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::type_info::name((type_info *)&int::typeinfo);
  fmt::v5::format<char[16],char_const*>(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::runtime_error::runtime_error(this_00,local_30);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FMT_NORETURN T operator()(U) {
    throw std::runtime_error(fmt::format("invalid type {}", typeid(U).name()));
  }